

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktOpaqueTypeIndexingTests.cpp
# Opt level: O2

TestStatus * __thiscall
vkt::shaderexecutor::anon_unknown_0::BlockArrayIndexingCaseInstance::iterate
          (TestStatus *__return_storage_ptr__,BlockArrayIndexingCaseInstance *this)

{
  deInt32 *pdVar1;
  deUint32 *this_00;
  int iVar2;
  uint uVar3;
  TestLog *pTVar4;
  pointer puVar5;
  pointer puVar6;
  pointer piVar7;
  PtrData<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  data;
  VkDescriptorSetLayoutBinding *pVVar8;
  VkDescriptorType descriptorType;
  SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer> *__cur;
  DeviceInterface *vk;
  VkDevice device;
  pointer pSVar9;
  Buffer *pBVar10;
  SharedPtrStateBase *pSVar11;
  pointer piVar12;
  VkDeviceSize *pVVar13;
  int readNdx;
  pointer ppvVar14;
  ulong uVar15;
  Hex<8UL> hex;
  long lVar16;
  long lVar17;
  Hex<8UL> hex_00;
  SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer> *this_01;
  long lVar18;
  int *piVar19;
  bool bVar20;
  bool bVar21;
  undefined4 in_stack_fffffffffffffca8;
  long lVar22;
  vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_> bufferInfos;
  VkDescriptorSetLayoutCreateInfo layoutInfo;
  Move<vk::Handle<(vk::HandleType)22>_> extraResourcesSet;
  MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
  indexBuffer;
  vector<void_*,_std::allocator<void_*>_> inputs;
  vector<int,_std::allocator<int>_> expandedIndices;
  Move<vk::Handle<(vk::HandleType)21>_> extraResourcesSetPool;
  Move<vk::Handle<(vk::HandleType)19>_> extraResourcesLayout;
  vector<void_*,_std::allocator<void_*>_> outputs;
  vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
  local_210;
  VkDescriptorPoolSize poolSizes [2];
  pointer local_1e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> outValues;
  VkDescriptorSetLayoutBinding bindings [2];
  
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&outValues,0x80,(allocator_type *)bindings);
  pTVar4 = ((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context)->m_testCtx->
           m_log;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)bindings,"Pass",(allocator<char> *)&bufferInfos);
  tcu::TestStatus::pass(__return_storage_ptr__,(string *)bindings);
  std::__cxx11::string::~string((string *)bindings);
  expandedIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  expandedIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  expandedIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  bVar21 = *(int *)&(this->super_OpaqueTypeIndexingTestInstance).field_0x34 == 0;
  vk = Context::getDeviceInterface
                 ((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context);
  device = Context::getDevice((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.
                              m_context);
  puVar5 = (this->m_inValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_start;
  puVar6 = (this->m_inValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  lVar16 = (long)puVar6 - (long)puVar5;
  uVar15 = lVar16 >> 2;
  if (uVar15 >> 0x3b == 0) {
    if (puVar6 == puVar5) {
      pSVar9 = (pointer)0x0;
    }
    else {
      pSVar9 = (pointer)operator_new(lVar16 * 4);
    }
    descriptorType = bVar21 ^ VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;
    local_210.
    super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = pSVar9 + uVar15;
    local_210.
    super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pSVar9;
    while (bVar20 = uVar15 != 0, uVar15 = uVar15 - 1, bVar20) {
      (local_210.
       super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->m_ptr = (Buffer *)0x0;
      (local_210.
       super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)->m_state = (SharedPtrStateBase *)0x0;
      local_210.
      super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           local_210.
           super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
           ._M_impl.super__Vector_impl_data._M_finish + 1;
    }
    indexBuffer.
    super_UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
    .m_data.ptr = (Buffer *)0x0;
    extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_allocator =
         (VkAllocationCallbacks *)0x0;
    extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal = 0
    ;
    extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)0x0;
    extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)0x0;
    extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
         0;
    extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface = (DeviceInterface *)0x0;
    extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
         (VkDevice)0x0;
    extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
    m_internal = 0;
    extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal = 0;
    extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)0x0;
    local_210.
    super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
    ._M_impl.super__Vector_impl_data._M_start = pSVar9;
    OpaqueTypeIndexingTestInstance::checkSupported
              (&this->super_OpaqueTypeIndexingTestInstance,descriptorType);
    lVar16 = 0;
    piVar19 = (int *)0x0;
    while( true ) {
      uVar15 = (long)(this->m_inValues->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_inValues->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
      if ((int *)((long)uVar15 >> 2) <= piVar19) break;
      pBVar10 = (Buffer *)operator_new(0x40);
      anon_unknown_0::Buffer::Buffer
                (pBVar10,(this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context,
                 (uint)!bVar21 * 0x10 + 0x10,4);
      bindings[0].descriptorCount = 0;
      bindings[0].stageFlags = 0;
      bindings[0]._0_8_ = pBVar10;
      pSVar11 = (SharedPtrStateBase *)operator_new(0x20);
      pSVar11->strongRefCount = 0;
      pSVar11->weakRefCount = 0;
      pSVar11->_vptr_SharedPtrStateBase = (_func_int **)&PTR__SharedPtrState_00bf4d18;
      pSVar11[1]._vptr_SharedPtrStateBase = (_func_int **)pBVar10;
      pSVar11->strongRefCount = 1;
      pSVar11->weakRefCount = 1;
      bindings[0]._8_8_ = pSVar11;
      if (*(SharedPtrStateBase **)((long)&pSVar9->m_state + lVar16) != pSVar11) {
        this_01 = (SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer> *)
                  ((long)&pSVar9->m_ptr + lVar16);
        de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>::release(this_01);
        this_01->m_ptr = pBVar10;
        this_01->m_state = pSVar11;
        LOCK();
        pSVar11->strongRefCount = pSVar11->strongRefCount + 1;
        UNLOCK();
        LOCK();
        pdVar1 = &this_01->m_state->weakRefCount;
        *pdVar1 = *pdVar1 + 1;
        UNLOCK();
        pSVar9 = local_210.
                 super__Vector_base<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>::release
                ((SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer> *)bindings);
      pBVar10 = *(Buffer **)((long)&pSVar9->m_ptr + lVar16);
      *(uint *)((pBVar10->m_allocation).
                super_UniqueBase<vk::Allocation,_de::DefaultDeleter<vk::Allocation>_>.m_data.ptr)->
               m_hostPtr =
           (this->m_inValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
           _M_impl.super__Vector_impl_data._M_start[(long)piVar19];
      anon_unknown_0::Buffer::flush(pBVar10);
      piVar19 = (int *)((long)piVar19 + 1);
      lVar16 = lVar16 + 0x10;
    }
    if ((this->super_OpaqueTypeIndexingTestInstance).m_indexExprType == INDEX_EXPR_TYPE_UNIFORM) {
      createUniformIndexBuffer
                ((MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
                  *)bindings,
                 (this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context,
                 (int)(this->m_readIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                      super__Vector_impl_data._M_start,(int *)((long)uVar15 >> 2));
      bindings[0].binding = 0;
      bindings[0].descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
      data.ptr._4_4_ = descriptorType;
      data.ptr._0_4_ = in_stack_fffffffffffffca8;
      data._8_8_ = device;
      de::details::
      MovePtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
      ::operator=(&indexBuffer,data);
      de::details::
      UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
      ::reset((UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
               *)bindings);
      uVar15 = (long)(this->m_inValues->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_inValues->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
    }
    bindings[0].binding = 0;
    bindings[1].binding = (deUint32)(uVar15 >> 2);
    bindings[0].stageFlags = 0x7fffffff;
    bindings[0].descriptorCount = bindings[1].binding;
    bindings[0].pImmutableSamplers = (VkSampler *)0x0;
    bindings[1].descriptorType = VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER;
    bindings[1].descriptorCount = 1;
    bindings[1].stageFlags = 0x7fffffff;
    bindings[1].pImmutableSamplers = (VkSampler *)0x0;
    layoutInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO;
    layoutInfo.pNext = (void *)0x0;
    layoutInfo.flags = 0;
    layoutInfo.bindingCount = 2;
    layoutInfo.pBindings = bindings;
    bindings[0].descriptorType = descriptorType;
    ::vk::createDescriptorSetLayout
              ((Move<vk::Handle<(vk::HandleType)19>_> *)poolSizes,vk,device,&layoutInfo,
               (VkAllocationCallbacks *)0x0);
    bufferInfos.
    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = local_1e8;
    bufferInfos.
    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)poolSizes[0];
    bufferInfos.
    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)poolSizes[1];
    poolSizes[0].type = VK_DESCRIPTOR_TYPE_SAMPLER;
    poolSizes[0].descriptorCount = 0;
    poolSizes[1].type = VK_DESCRIPTOR_TYPE_SAMPLER;
    poolSizes[1].descriptorCount = 0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::reset
              (&extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>);
    extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_device =
         (VkDevice)
         bufferInfos.
         super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.object.m_internal =
         (deUint64)
         bufferInfos.
         super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
    extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.deleter.m_deviceIface
         = (DeviceInterface *)
           bufferInfos.
           super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
           ._M_impl.super__Vector_impl_data._M_finish;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)19>_> *)poolSizes);
    poolSizes[0].descriptorCount =
         (deUint32)
         ((ulong)((long)(this->m_inValues->
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                        super__Vector_impl_data._M_finish -
                 (long)(this->m_inValues->
                       super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                       super__Vector_impl_data._M_start) >> 2);
    poolSizes[0].type = descriptorType;
    poolSizes[1].type = VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER;
    poolSizes[1].descriptorCount = 1;
    bindings[0].binding = 0x21;
    bindings[0].descriptorCount = 0;
    bindings[0].stageFlags = 0;
    bindings[0].pImmutableSamplers = (VkSampler *)0x100000001;
    bindings[1].binding = 2;
    bindings[1]._8_8_ = poolSizes;
    ::vk::createDescriptorPool
              ((Move<vk::Handle<(vk::HandleType)21>_> *)&layoutInfo,vk,device,
               (VkDescriptorPoolCreateInfo *)bindings,(VkAllocationCallbacks *)0x0);
    pVVar8 = layoutInfo.pBindings;
    bufferInfos.
    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)layoutInfo._16_8_;
    bufferInfos.
    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)layoutInfo._0_8_;
    bufferInfos.
    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)layoutInfo.pNext;
    layoutInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    layoutInfo._4_4_ = 0;
    layoutInfo.pNext = (void *)0x0;
    layoutInfo.flags = 0;
    layoutInfo.bindingCount = 0;
    layoutInfo.pBindings = (VkDescriptorSetLayoutBinding *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::reset
              (&extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>);
    extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
         (VkDevice)
         bufferInfos.
         super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
         = (VkAllocationCallbacks *)pVVar8;
    extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
         (deUint64)
         bufferInfos.
         super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
    extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
    m_deviceIface =
         (DeviceInterface *)
         bufferInfos.
         super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)21>_> *)&layoutInfo);
    bindings[0].binding = 0x22;
    bindings[0].descriptorCount = 0;
    bindings[0].stageFlags = 0;
    bindings[0].pImmutableSamplers =
         (VkSampler *)
         extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
         m_internal;
    bindings[1].binding = 1;
    bindings[1]._8_8_ = &extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>;
    ::vk::allocateDescriptorSet
              ((Move<vk::Handle<(vk::HandleType)22>_> *)&layoutInfo,vk,device,
               (VkDescriptorSetAllocateInfo *)bindings);
    pVVar8 = layoutInfo.pBindings;
    bufferInfos.
    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)layoutInfo._16_8_;
    bufferInfos.
    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)layoutInfo._0_8_;
    bufferInfos.
    super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)layoutInfo.pNext;
    layoutInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
    layoutInfo._4_4_ = 0;
    layoutInfo.pNext = (void *)0x0;
    layoutInfo.flags = 0;
    layoutInfo.bindingCount = 0;
    layoutInfo.pBindings = (VkDescriptorSetLayoutBinding *)0x0;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::reset
              (&extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
         (VkDevice)
         bufferInfos.
         super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
    m_internal = (deUint64)pVVar8;
    extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal =
         (deUint64)
         bufferInfos.
         super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
         ._M_impl.super__Vector_impl_data._M_start;
    extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_deviceIface =
         (DeviceInterface *)
         bufferInfos.
         super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
              ((RefBase<vk::Handle<(vk::HandleType)22>_> *)&layoutInfo);
    std::vector<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::vector
              (&bufferInfos,
               (long)(this->m_inValues->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->m_inValues->
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start >> 2,(allocator_type *)bindings);
    bindings[0].binding = 0x23;
    bindings[0].descriptorCount = 0;
    bindings[0].stageFlags = 0;
    bindings[0].pImmutableSamplers =
         (VkSampler *)
         extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal;
    bindings[1].binding = 0;
    bindings[1].descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
    lVar16 = (long)(this->m_inValues->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(this->m_inValues->
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2;
    bindings[1].descriptorCount = (deUint32)lVar16;
    bindings[1].pImmutableSamplers = (VkSampler *)0x0;
    pVVar13 = &(bufferInfos.
                super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                ._M_impl.super__Vector_impl_data._M_start)->range;
    while (bVar21 = lVar16 != 0, lVar16 = lVar16 + -1, bVar21) {
      (((VkDescriptorBufferInfo *)(pVVar13 + -2))->buffer).m_internal =
           (pSVar9->m_ptr->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.object.
           m_internal;
      pVVar13[-1] = 0;
      *pVVar13 = 0xffffffffffffffff;
      pVVar13 = pVVar13 + 3;
      pSVar9 = pSVar9 + 1;
    }
    bindings[1].stageFlags = descriptorType;
    (*vk->_vptr_DeviceInterface[0x3e])(vk,device,1,bindings,0,0);
    std::_Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>::
    ~_Vector_base(&bufferInfos.
                   super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>
                 );
    if (indexBuffer.
        super_UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
        .m_data.ptr != (Buffer *)0x0) {
      bufferInfos.
      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
      _M_impl.super__Vector_impl_data._M_start =
           (pointer)((indexBuffer.
                      super_UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
                      .m_data.ptr)->m_buffer).super_RefBase<vk::Handle<(vk::HandleType)8>_>.m_data.
                    object.m_internal;
      bufferInfos.
      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      bufferInfos.
      super__Vector_base<vk::VkDescriptorBufferInfo,_std::allocator<vk::VkDescriptorBufferInfo>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0xffffffffffffffff;
      bindings[0].binding = 0x23;
      bindings[0].descriptorCount = 0;
      bindings[0].stageFlags = 0;
      bindings[0].pImmutableSamplers =
           (VkSampler *)
           extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal
      ;
      bindings[1].binding =
           (deUint32)
           ((ulong)((long)(this->m_inValues->
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->m_inValues->
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                         super__Vector_impl_data._M_start) >> 2);
      bindings[1].descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
      bindings[1].descriptorCount = 1;
      bindings[1].stageFlags = 6;
      bindings[1].pImmutableSamplers = (VkSampler *)0x0;
      (*vk->_vptr_DeviceInterface[0x3e])(vk,device,1,bindings,0,0);
    }
    if ((this->super_OpaqueTypeIndexingTestInstance).m_indexExprType ==
        INDEX_EXPR_TYPE_DYNAMIC_UNIFORM) {
      std::vector<int,_std::allocator<int>_>::resize
                (&expandedIndices,
                 ((long)(this->m_readIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                        .super__Vector_impl_data._M_finish -
                 (long)(this->m_readIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start) * 8);
      piVar7 = (this->m_readIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      piVar12 = expandedIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
        iVar2 = piVar7[lVar16];
        for (lVar17 = 0; lVar17 != 0x80; lVar17 = lVar17 + 4) {
          *(int *)((long)piVar12 + lVar17) = iVar2;
        }
        piVar12 = piVar12 + 0x20;
      }
      for (lVar16 = 0; lVar16 != 0x200; lVar16 = lVar16 + 0x80) {
        bindings[0]._0_8_ =
             (long)expandedIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start + lVar16;
        std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                  ((vector<void*,std::allocator<void*>> *)&inputs,(void **)bindings);
      }
    }
    for (lVar16 = 0; lVar16 != 0x200; lVar16 = lVar16 + 0x80) {
      bindings[0]._0_8_ =
           (long)outValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start + lVar16;
      std::vector<void*,std::allocator<void*>>::emplace_back<void*>
                ((vector<void*,std::allocator<void*>> *)&outputs,(void **)bindings);
    }
    bindings[0]._0_8_ =
         createExecutor((this->super_OpaqueTypeIndexingTestInstance).super_TestInstance.m_context,
                        (this->super_OpaqueTypeIndexingTestInstance).m_shaderType,
                        (this->super_OpaqueTypeIndexingTestInstance).m_shaderSpec,
                        (VkDescriptorSetLayout)
                        extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data.
                        object.m_internal);
    ppvVar14 = (pointer)0x0;
    if (inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      ppvVar14 = inputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
    }
    (*((ShaderExecutor *)bindings[0]._0_8_)->_vptr_ShaderExecutor[2])
              (bindings[0]._0_8_,0x20,ppvVar14,
               outputs.super__Vector_base<void_*,_std::allocator<void_*>_>._M_impl.
               super__Vector_impl_data._M_start,
               extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
               m_internal);
    de::details::
    UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
    ::~UniqueBase((UniqueBase<vkt::shaderexecutor::ShaderExecutor,_de::DefaultDeleter<vkt::shaderexecutor::ShaderExecutor>_>
                   *)bindings);
    this_00 = &bindings[0].descriptorCount;
    lVar17 = 0;
    for (lVar16 = 0; lVar16 != 0x20; lVar16 = lVar16 + 1) {
      lVar22 = lVar17;
      for (lVar18 = 0; lVar18 != 4; lVar18 = lVar18 + 1) {
        uVar3 = (this->m_inValues->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                _M_impl.super__Vector_impl_data._M_start
                [(this->m_readIndices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start[lVar18]];
        hex_00.value._4_4_ = 0;
        hex_00.value._0_4_ = uVar3;
        hex.value._4_4_ = 0;
        hex.value._0_4_ =
             *(uint *)((long)outValues.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start + lVar17);
        if (uVar3 != *(uint *)((long)outValues.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start + lVar17)) {
          bindings[0]._0_8_ = pTVar4;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
          std::operator<<((ostream *)this_00,"ERROR: at invocation ");
          std::ostream::operator<<(this_00,(int)lVar16);
          std::operator<<((ostream *)this_00,", read ");
          std::ostream::operator<<(this_00,(int)lVar18);
          std::operator<<((ostream *)this_00,": expected ");
          tcu::Format::operator<<((ostream *)this_00,hex_00);
          std::operator<<((ostream *)this_00,", got ");
          tcu::Format::operator<<((ostream *)this_00,hex);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)bindings,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
          if (__return_storage_ptr__->m_code == QP_TEST_RESULT_PASS) {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&bufferInfos,"Invalid result value",(allocator<char> *)&layoutInfo)
            ;
            tcu::TestStatus::fail((TestStatus *)bindings,(string *)&bufferInfos);
            tcu::TestStatus::operator=(__return_storage_ptr__,(TestStatus *)bindings);
            std::__cxx11::string::~string((string *)&bindings[0].descriptorCount);
            std::__cxx11::string::~string((string *)&bufferInfos);
          }
        }
        lVar17 = lVar17 + 0x80;
      }
      lVar17 = lVar22 + 4;
    }
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)22>_>::~RefBase
              (&extraResourcesSet.super_RefBase<vk::Handle<(vk::HandleType)22>_>);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)21>_>::~RefBase
              (&extraResourcesSetPool.super_RefBase<vk::Handle<(vk::HandleType)21>_>);
    ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)19>_>::~RefBase
              (&extraResourcesLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>);
    de::details::
    UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
    ::reset(&indexBuffer.
             super_UniqueBase<vkt::shaderexecutor::(anonymous_namespace)::Buffer,_de::DefaultDeleter<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>
           );
    std::
    vector<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>,_std::allocator<de::SharedPtr<vkt::shaderexecutor::(anonymous_namespace)::Buffer>_>_>
    ::~vector(&local_210);
    std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
              (&outputs.super__Vector_base<void_*,_std::allocator<void_*>_>);
    std::_Vector_base<void_*,_std::allocator<void_*>_>::~_Vector_base
              (&inputs.super__Vector_base<void_*,_std::allocator<void_*>_>);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&expandedIndices.super__Vector_base<int,_std::allocator<int>_>);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&outValues.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    return __return_storage_ptr__;
  }
  std::__throw_length_error("cannot create std::vector larger than max_size()");
}

Assistant:

tcu::TestStatus BlockArrayIndexingCaseInstance::iterate (void)
{
	const int					numInvocations		= NUM_INVOCATIONS;
	const int					numReads			= NUM_READS;
	std::vector<deUint32>		outValues			(numInvocations*numReads);

	tcu::TestLog&				log					= m_context.getTestContext().getLog();
	tcu::TestStatus				testResult			= tcu::TestStatus::pass("Pass");

	std::vector<int>			expandedIndices;
	std::vector<void*>			inputs;
	std::vector<void*>			outputs;
	const VkBufferUsageFlags	bufferUsage			= m_blockType == BLOCKTYPE_UNIFORM ? VK_BUFFER_USAGE_UNIFORM_BUFFER_BIT : VK_BUFFER_USAGE_STORAGE_BUFFER_BIT;
	const VkDescriptorType		descriptorType		= m_blockType == BLOCKTYPE_UNIFORM ? VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER : VK_DESCRIPTOR_TYPE_STORAGE_BUFFER;

	const DeviceInterface&		vkd					= m_context.getDeviceInterface();
	const VkDevice				device				= m_context.getDevice();

	// \note Using separate buffer per element - might want to test
	// offsets & single buffer in the future.
	vector<BufferSp>			buffers				(m_inValues.size());
	MovePtr<Buffer>				indexBuffer;

	Move<VkDescriptorSetLayout>	extraResourcesLayout;
	Move<VkDescriptorPool>		extraResourcesSetPool;
	Move<VkDescriptorSet>		extraResourcesSet;

	checkSupported(descriptorType);

	for (size_t bufferNdx = 0; bufferNdx < m_inValues.size(); ++bufferNdx)
	{
		buffers[bufferNdx] = BufferSp(new Buffer(m_context, bufferUsage, sizeof(deUint32)));
		*(deUint32*)buffers[bufferNdx]->getHostPtr() = m_inValues[bufferNdx];
		buffers[bufferNdx]->flush();
	}

	if (m_indexExprType == INDEX_EXPR_TYPE_UNIFORM)
		indexBuffer = createUniformIndexBuffer(m_context, numReads, &m_readIndices[0]);

	{
		const VkDescriptorSetLayoutBinding		bindings[]	=
		{
			{ 0u,							descriptorType,						(deUint32)m_inValues.size(),	VK_SHADER_STAGE_ALL,	DE_NULL		},
			{ (deUint32)m_inValues.size(),	VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,	1u,								VK_SHADER_STAGE_ALL,	DE_NULL		}
		};
		const VkDescriptorSetLayoutCreateInfo	layoutInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_LAYOUT_CREATE_INFO,
			DE_NULL,
			(VkDescriptorSetLayoutCreateFlags)0u,
			DE_LENGTH_OF_ARRAY(bindings),
			bindings,
		};

		extraResourcesLayout = createDescriptorSetLayout(vkd, device, &layoutInfo);
	}

	{
		const VkDescriptorPoolSize			poolSizes[]	=
		{
			{ descriptorType,						(deUint32)m_inValues.size()	},
			{ VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,	1u,							}
		};
		const VkDescriptorPoolCreateInfo	poolInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			(VkDescriptorPoolCreateFlags)VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,
			1u,		// maxSets
			DE_LENGTH_OF_ARRAY(poolSizes),
			poolSizes,
		};

		extraResourcesSetPool = createDescriptorPool(vkd, device, &poolInfo);
	}

	{
		const VkDescriptorSetAllocateInfo	allocInfo	=
		{
			VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,
			*extraResourcesSetPool,
			1u,
			&extraResourcesLayout.get(),
		};

		extraResourcesSet = allocateDescriptorSet(vkd, device, &allocInfo);
	}

	{
		vector<VkDescriptorBufferInfo>	bufferInfos			(m_inValues.size());
		const VkWriteDescriptorSet		descriptorWrite		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
			DE_NULL,
			*extraResourcesSet,
			0u,		// dstBinding
			0u,		// dstArrayElement
			(deUint32)m_inValues.size(),
			descriptorType,
			(const VkDescriptorImageInfo*)DE_NULL,
			&bufferInfos[0],
			(const VkBufferView*)DE_NULL,
		};

		for (size_t ndx = 0; ndx < m_inValues.size(); ++ndx)
		{
			bufferInfos[ndx].buffer		= buffers[ndx]->getBuffer();
			bufferInfos[ndx].offset		= 0u;
			bufferInfos[ndx].range		= VK_WHOLE_SIZE;
		}

		vkd.updateDescriptorSets(device, 1u, &descriptorWrite, 0u, DE_NULL);
	}

	if (indexBuffer)
	{
		const VkDescriptorBufferInfo	bufferInfo	=
		{
			indexBuffer->getBuffer(),
			0u,
			VK_WHOLE_SIZE
		};
		const VkWriteDescriptorSet		descriptorWrite		=
		{
			VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
			DE_NULL,
			*extraResourcesSet,
			(deUint32)m_inValues.size(),	// dstBinding
			0u,								// dstArrayElement
			1u,
			VK_DESCRIPTOR_TYPE_UNIFORM_BUFFER,
			(const VkDescriptorImageInfo*)DE_NULL,
			&bufferInfo,
			(const VkBufferView*)DE_NULL,
		};

		vkd.updateDescriptorSets(device, 1u, &descriptorWrite, 0u, DE_NULL);
	}

	if (m_indexExprType == INDEX_EXPR_TYPE_DYNAMIC_UNIFORM)
	{
		expandedIndices.resize(numInvocations * m_readIndices.size());

		for (int readNdx = 0; readNdx < numReads; readNdx++)
		{
			int* dst = &expandedIndices[numInvocations*readNdx];
			std::fill(dst, dst+numInvocations, m_readIndices[readNdx]);
		}

		for (int readNdx = 0; readNdx < numReads; readNdx++)
			inputs.push_back(&expandedIndices[readNdx*numInvocations]);
	}

	for (int readNdx = 0; readNdx < numReads; readNdx++)
		outputs.push_back(&outValues[readNdx*numInvocations]);

	{
		UniquePtr<ShaderExecutor>	executor	(createExecutor(m_context, m_shaderType, m_shaderSpec, *extraResourcesLayout));

		executor->execute(numInvocations, inputs.empty() ? DE_NULL : &inputs[0], &outputs[0], *extraResourcesSet);
	}

	for (int invocationNdx = 0; invocationNdx < numInvocations; invocationNdx++)
	{
		for (int readNdx = 0; readNdx < numReads; readNdx++)
		{
			const deUint32	refValue	= m_inValues[m_readIndices[readNdx]];
			const deUint32	resValue	= outValues[readNdx*numInvocations + invocationNdx];

			if (refValue != resValue)
			{
				log << tcu::TestLog::Message << "ERROR: at invocation " << invocationNdx
					<< ", read " << readNdx << ": expected "
					<< tcu::toHex(refValue) << ", got " << tcu::toHex(resValue)
					<< tcu::TestLog::EndMessage;

				if (testResult.getCode() == QP_TEST_RESULT_PASS)
					testResult = tcu::TestStatus::fail("Invalid result value");
			}
		}
	}

	return testResult;
}